

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_arrowhead.cpp
# Opt level: O2

void __thiscall agg::arrowhead::arrowhead(arrowhead *this)

{
  this->m_head_d1 = 1.0;
  this->m_head_d2 = 1.0;
  this->m_head_d3 = 1.0;
  this->m_head_d4 = 0.0;
  this->m_tail_d1 = 1.0;
  this->m_tail_d2 = 1.0;
  this->m_tail_d3 = 1.0;
  this->m_tail_d4 = 0.0;
  this->m_head_flag = false;
  this->m_tail_flag = false;
  this->m_curr_id = 0;
  this->m_curr_coord = 0;
  return;
}

Assistant:

arrowhead::arrowhead() :
        m_head_d1(1.0),
        m_head_d2(1.0),
        m_head_d3(1.0),
        m_head_d4(0.0),
        m_tail_d1(1.0),
        m_tail_d2(1.0),
        m_tail_d3(1.0),
        m_tail_d4(0.0),
        m_head_flag(false),
        m_tail_flag(false),
        m_curr_id(0),
        m_curr_coord(0)
    {
    }